

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O2

void dasm_put(BuildCtx *ctx,int start,...)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  dasm_State *pdVar4;
  dasm_ActList puVar5;
  dasm_Section *pdVar6;
  ulong uVar7;
  char in_AL;
  ulong uVar8;
  int *piVar9;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar10;
  int iVar11;
  undefined8 in_R8;
  uint uVar12;
  undefined8 in_R9;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  byte *pbVar16;
  byte *pbVar17;
  int iVar18;
  int *piVar19;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  int local_e8 [4];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  pdVar4 = ctx->D;
  puVar5 = pdVar4->actionlist;
  pdVar6 = pdVar4->section;
  uVar15 = pdVar6->pos;
  iVar10 = pdVar6->ofs;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((int)uVar15 < pdVar6->epos) {
    piVar9 = pdVar6->rbuf;
  }
  else {
    uVar13 = pdVar6->bsize;
    uVar8 = uVar13 + 200;
    if (uVar13 < 0xffffffffffffff38) {
      uVar7 = 0x10;
      if (0x10 < uVar13) {
        uVar7 = uVar13;
      }
      do {
        uVar13 = uVar7;
        uVar7 = uVar13 * 2;
      } while (uVar13 < uVar8);
      piVar9 = (int *)realloc(pdVar6->buf,uVar13);
      pdVar6->buf = piVar9;
      if (piVar9 == (int *)0x0) {
        exit(1);
      }
      pdVar6->bsize = uVar13;
    }
    else {
      piVar9 = pdVar6->buf;
    }
    piVar9 = piVar9 + -(ulong)(uVar15 & 0xff000000);
    pdVar6->rbuf = piVar9;
    pdVar6->epos = (int)((ulong)(long)(int)uVar13 >> 2) + (uVar15 & 0xff000000) + -0x19;
  }
  piVar9[(int)uVar15] = start;
  ap[0].overflow_arg_area = &stack0x00000008;
  uVar12 = 0x10;
  pbVar16 = puVar5 + start;
  iVar18 = uVar15 + 1;
LAB_0010563b:
  while( true ) {
    pbVar17 = pbVar16 + 1;
    bVar1 = *pbVar16;
    if (0xe8 < bVar1) break;
    iVar10 = iVar10 + 1;
    pbVar16 = pbVar17;
  }
  switch(bVar1) {
  case 0xf4:
  case 0xf6:
    bVar2 = pbVar16[1];
    pbVar17 = pbVar16 + 2;
    piVar19 = (int *)((ulong)((uint)bVar2 * 4) + (long)pdVar4->lglabels);
    if (bVar2 < 0xf7) {
      if (((bVar2 < 10) && (-1 < *piVar19)) || (pdVar4->lgsize <= (ulong)bVar2 << 2))
      goto LAB_001059ed;
      goto LAB_001057c8;
    }
    iVar11 = piVar19[-0xf6];
    piVar19 = piVar19 + -0xf6;
    if (iVar11 < 1) {
      iVar11 = 0;
    }
LAB_001057cf:
    piVar9[iVar18] = iVar11;
    *piVar19 = iVar18;
    break;
  case 0xf5:
  case 0xf7:
    uVar13 = (ulong)uVar12;
    if (uVar13 < 0x29) {
      uVar12 = uVar12 + 8;
      piVar19 = (int *)((long)local_e8 + uVar13);
    }
    else {
      piVar19 = (int *)ap[0].overflow_arg_area;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
    }
    if (pdVar4->pcsize <= (ulong)((long)*piVar19 * 4)) {
LAB_001059db:
      uVar15 = (int)pbVar17 + ~*(uint *)&pdVar4->actionlist | 0x14000000;
      goto LAB_00105a48;
    }
    piVar19 = pdVar4->pclabels + *piVar19;
LAB_001057c8:
    iVar11 = *piVar19;
    if (-1 < iVar11) goto LAB_001057cf;
    piVar9[iVar18] = -iVar11;
    break;
  case 0xf8:
    pbVar17 = pbVar16 + 2;
    if (pdVar4->lgsize <= (ulong)pbVar16[1] * 4) {
LAB_001059ed:
      pdVar4->status = (int)pbVar16 + 2 + ~*(uint *)&pdVar4->actionlist | 0x13000000;
      return;
    }
    puVar14 = (uint *)(pdVar4->lglabels + pbVar16[1]);
    goto LAB_00105967;
  case 0xf9:
    uVar13 = (ulong)uVar12;
    if (uVar13 < 0x29) {
      uVar12 = uVar12 + 8;
      piVar19 = (int *)((long)local_e8 + uVar13);
    }
    else {
      piVar19 = (int *)ap[0].overflow_arg_area;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
    }
    if (pdVar4->pcsize <= (ulong)((long)*piVar19 * 4)) goto LAB_001059db;
    puVar14 = (uint *)(pdVar4->pclabels + *piVar19);
LAB_00105967:
    uVar15 = *puVar14;
    while (0 < (int)uVar15) {
      piVar19 = pdVar4->sections[uVar15 >> 0x18].rbuf;
      uVar3 = piVar19[uVar15];
      piVar19[uVar15] = iVar18;
      uVar15 = uVar3;
    }
    *puVar14 = -iVar18;
LAB_0010598e:
    piVar9[iVar18] = iVar10;
    pbVar16 = pbVar17;
    iVar18 = iVar18 + 1;
    goto LAB_0010563b;
  case 0xfa:
    pbVar17 = pbVar16 + 2;
    iVar10 = iVar10 + (uint)pbVar16[1];
    goto LAB_0010598e;
  case 0xfb:
    iVar10 = iVar10 + 4;
    pbVar16 = pbVar16 + 3;
    goto LAB_0010563b;
  case 0xfc:
    iVar10 = iVar10 + 1;
    pbVar16 = pbVar16 + 2;
    goto LAB_0010563b;
  case 0xfd:
    goto switchD_001056a4_caseD_fd;
  case 0xfe:
    if ((int)(uint)*pbVar17 < pdVar4->maxsection) {
      pdVar4->section = pdVar4->sections + *pbVar17;
switchD_001056a4_caseD_ff:
      pdVar6->pos = iVar18;
      pdVar6->ofs = iVar10;
    }
    else {
      uVar15 = (int)pbVar17 + ~*(uint *)&pdVar4->actionlist | 0x12000000;
LAB_00105a48:
      pdVar4->status = uVar15;
    }
    return;
  case 0xff:
    goto switchD_001056a4_caseD_ff;
  default:
    if ((ulong)uVar12 < 0x29) {
      piVar9[iVar18] = *(int *)((long)local_e8 + (ulong)uVar12);
      (*(code *)(&DAT_0010b040 + *(int *)(&DAT_0010b040 + (ulong)(bVar1 - 0xe9) * 4)))
                (&DAT_0010b040 + *(int *)(&DAT_0010b040 + (ulong)(bVar1 - 0xe9) * 4));
      return;
    }
    piVar9[iVar18] = *ap[0].overflow_arg_area;
    (*(code *)(&DAT_0010b040 + *(int *)(&DAT_0010b040 + (ulong)(bVar1 - 0xe9) * 4)))
              (&DAT_0010b040 + *(int *)(&DAT_0010b040 + (ulong)(bVar1 - 0xe9) * 4),&DAT_0010b040,
               0xffffffffffffffff);
    return;
  }
  pbVar16 = pbVar17;
  if ((bVar1 & 0xfe) == 0xf4) {
    iVar10 = iVar10 + 4;
    piVar9[iVar18 + 1] = iVar10;
    iVar18 = iVar18 + 2;
  }
  else {
    iVar10 = iVar10 + 8;
    iVar18 = iVar18 + 1;
  }
  goto LAB_0010563b;
switchD_001056a4_caseD_fd:
  pbVar16 = pbVar17;
  goto LAB_0010563b;
}

Assistant:

void dasm_put(Dst_DECL, int start, ...)
{
  va_list ap;
  dasm_State *D = Dst_REF;
  dasm_ActList p = D->actionlist + start;
  dasm_Section *sec = D->section;
  int pos = sec->pos, ofs = sec->ofs, mrm = -1;
  int *b;

  if (pos >= sec->epos) {
    DASM_M_GROW(Dst, int, sec->buf, sec->bsize,
      sec->bsize + 2*DASM_MAXSECPOS*sizeof(int));
    sec->rbuf = sec->buf - DASM_POS2BIAS(pos);
    sec->epos = (int)sec->bsize/sizeof(int) - DASM_MAXSECPOS+DASM_POS2BIAS(pos);
  }

  b = sec->rbuf;
  b[pos++] = start;

  va_start(ap, start);
  while (1) {
    int action = *p++;
    if (action < DASM_DISP) {
      ofs++;
    } else if (action <= DASM_REL_A) {
      int n = va_arg(ap, int);
      b[pos++] = n;
      switch (action) {
      case DASM_DISP:
	if (n == 0) { if (mrm < 0) mrm = p[-2]; if ((mrm&7) != 5) break; }
	/* fallthrough */
      case DASM_IMM_DB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_REL_A: /* Assumes ptrdiff_t is int. !x64 */
      case DASM_IMM_D: ofs += 4; break;
      case DASM_IMM_S: CK(((n+128)&-256) == 0, RANGE_I); goto ob;
      case DASM_IMM_B: CK((n&-256) == 0, RANGE_I); ob: ofs++; break;
      case DASM_IMM_WB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_IMM_W: CK((n&-65536) == 0, RANGE_I); ofs += 2; break;
      case DASM_SPACE: p++; ofs += n; break;
      case DASM_SETLABEL: b[pos-2] = -0x40000000; break;  /* Neg. label ofs. */
      case DASM_VREG: CK((n&-16) == 0 && (n != 4 || (*p>>5) != 2), RANGE_VREG);
	if (*p < 0x40 && p[1] == DASM_DISP) mrm = n;
	if (*p < 0x20 && (n&7) == 4) ofs++;
	switch ((*p++ >> 3) & 3) {
	case 3: n |= b[pos-3]; /* fallthrough */
	case 2: n |= b[pos-2]; /* fallthrough */
	case 1: if (n <= 7) { b[pos-1] |= 0x10; ofs--; }
	}
	continue;
      }
      mrm = -1;
    } else {
      int *pl, n;
      switch (action) {
      case DASM_REL_LG:
      case DASM_IMM_LG:
	n = *p++; pl = D->lglabels + n;
	/* Bkwd rel or global. */
	if (n <= 246) { CK(n>=10||*pl<0, RANGE_LG); CKPL(lg, LG); goto putrel; }
	pl -= 246; n = *pl;
	if (n < 0) n = 0;  /* Start new chain for fwd rel if label exists. */
	goto linkrel;
      case DASM_REL_PC:
      case DASM_IMM_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putrel:
	n = *pl;
	if (n < 0) {  /* Label exists. Get label pos and store it. */
	  b[pos] = -n;
	} else {
      linkrel:
	  b[pos] = n;  /* Else link to rel chain, anchored at label. */
	  *pl = pos;
	}
	pos++;
	ofs += 4;  /* Maximum offset needed. */
	if (action == DASM_REL_LG || action == DASM_REL_PC) {
	  b[pos++] = ofs;  /* Store pass1 offset estimate. */
	} else if (sizeof(ptrdiff_t) == 8) {
	  ofs += 4;
	}
	break;
      case DASM_LABEL_LG: pl = D->lglabels + *p++; CKPL(lg, LG); goto putlabel;
      case DASM_LABEL_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putlabel:
	n = *pl;  /* n > 0: Collapse rel chain and replace with label pos. */
	while (n > 0) { int *pb = DASM_POS2PTR(D, n); n = *pb; *pb = pos; }
	*pl = -pos;  /* Label exists now. */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_ALIGN:
	ofs += *p++;  /* Maximum alignment needed (arg is 2**n-1). */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_EXTERN: p += 2; ofs += 4; break;
      case DASM_ESC: p++; ofs++; break;
      case DASM_MARK: mrm = p[-2]; break;
      case DASM_SECTION:
	n = *p; CK(n < D->maxsection, RANGE_SEC); D->section = &D->sections[n];
      case DASM_STOP: goto stop;
      }
    }
  }
stop:
  va_end(ap);
  sec->pos = pos;
  sec->ofs = ofs;
}